

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O2

LinConEQ * __thiscall
mp::LinearFunctionalConstraint::to_linear_constraint
          (LinConEQ *__return_storage_ptr__,LinearFunctionalConstraint *this)

{
  LinTerms le;
  LinTerms local_90;
  
  LinTerms::LinTerms(&le,&(this->affine_expr_).super_LinTerms);
  LinTerms::add_term(&le,-1.0,(this->super_FunctionalConstraint).result_var_);
  LinTerms::LinTerms(&local_90,&le);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (__return_storage_ptr__,&local_90,
             (AlgConRhs<0>)((this->affine_expr_).constant_term_ ^ 0x8000000000000000),true);
  LinTerms::~LinTerms(&local_90);
  LinTerms::~LinTerms(&le);
  return __return_storage_ptr__;
}

Assistant:

LinConEQ to_linear_constraint() const {
    const auto& ae = GetAffineExpr();
    auto le = ae.GetLinTerms();
    le.add_term(-1.0, FunctionalConstraint::GetResultVar());
    return { std::move(le), -ae.constant_term() };
  }